

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_SINCDECP_z(DisasContext_conflict1 *s,arg_incdec2_pred *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i64 val_00;
  TCGv_i64 val;
  TCGContext_conflict1 *tcg_ctx;
  arg_incdec2_pred *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (a->esz == 0) {
    s_local._7_1_ = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      val_00 = tcg_temp_new_i64(tcg_ctx_00);
      do_cntp(s,val_00,a->esz,a->pg,a->pg);
      do_sat_addsub_vec(s,a->esz,a->rd,a->rn,val_00,a->u != 0,a->d != 0);
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_SINCDECP_z(DisasContext *s, arg_incdec2_pred *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0) {
        return false;
    }
    if (sve_access_check(s)) {
        TCGv_i64 val = tcg_temp_new_i64(tcg_ctx);
        do_cntp(s, val, a->esz, a->pg, a->pg);
        do_sat_addsub_vec(s, a->esz, a->rd, a->rn, val, a->u, a->d);
    }
    return true;
}